

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.c++
# Opt level: O1

ArrayPtr<void_*const>
kj::computeRelativeTrace(ArrayPtr<void_*const> trace,ArrayPtr<void_*const> relativeTo)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  ulong uVar11;
  ulong uVar12;
  uint uVar13;
  ulong uVar14;
  bool bVar16;
  ArrayPtr<void_*const> AVar17;
  ulong uVar15;
  
  uVar7 = trace.size_;
  uVar2 = relativeTo.size_;
  uVar3 = uVar7;
  if (3 < uVar2 && 3 < uVar7) {
    if ((long)(4 - uVar7) <= (long)(uVar2 - 4)) {
      uVar9 = uVar7 - 4;
      uVar6 = 3;
      uVar8 = 4 - uVar7;
      do {
        uVar12 = 0;
        if (0 < (long)uVar8) {
          uVar12 = uVar8;
        }
        uVar4 = 0;
        if (0 < (long)uVar9) {
          uVar4 = uVar9;
        }
        uVar1 = (uVar7 - 1) - uVar4;
        uVar11 = (uVar2 - 1) - uVar12;
        if (uVar1 < uVar11) {
          uVar11 = uVar1;
        }
        uVar1 = ~uVar12 + uVar2;
        if (~uVar4 + uVar7 < ~uVar12 + uVar2) {
          uVar1 = ~uVar4 + uVar7;
        }
        lVar10 = -uVar8;
        if (-uVar8 == 0 || 0 < (long)uVar8) {
          lVar10 = 0;
        }
        if (uVar7 - lVar10 == 0) {
          uVar15 = 0;
        }
        else {
          uVar15 = 0;
          if (uVar2 != uVar12) {
            lVar5 = -8;
            uVar14 = 0;
            do {
              uVar15 = uVar14;
              if (*(long *)((long)trace.ptr + lVar5 + uVar4 * -8 + uVar7 * 8) !=
                  *(long *)((long)relativeTo.ptr + lVar5 + uVar12 * -8 + uVar2 * 8)) break;
              uVar14 = uVar14 + 1;
              lVar5 = lVar5 + -8;
              uVar15 = uVar1 + 1;
            } while (uVar11 + 1 != uVar14);
          }
        }
        uVar13 = (uint)uVar15;
        bVar16 = uVar6 < uVar13;
        if (uVar13 < uVar6) {
          uVar13 = uVar6;
        }
        uVar6 = uVar13;
        if (bVar16) {
          uVar3 = ((uVar7 - lVar10) - (uVar15 & 0xffffffff)) + 1;
        }
        uVar9 = uVar9 - 1;
        bVar16 = uVar8 != uVar2 - 4;
        uVar8 = uVar8 + 1;
      } while (bVar16);
    }
  }
  AVar17.size_ = uVar3;
  AVar17.ptr = trace.ptr;
  return AVar17;
}

Assistant:

kj::ArrayPtr<void* const> computeRelativeTrace(
    kj::ArrayPtr<void* const> trace, kj::ArrayPtr<void* const> relativeTo) {
  using miniposix::ssize_t;

  static constexpr size_t MIN_MATCH_LEN = 4;
  if (trace.size() < MIN_MATCH_LEN || relativeTo.size() < MIN_MATCH_LEN) {
    return trace;
  }

  kj::ArrayPtr<void* const> bestMatch = trace;
  uint bestMatchLen = MIN_MATCH_LEN - 1;  // must beat this to choose something else

  // `trace` and `relativeTrace` may have been truncated at different points. We iterate through
  // truncating various suffixes from one of the two and then seeing if the remaining suffixes
  // match.
  for (ssize_t i = -(ssize_t)(trace.size() - MIN_MATCH_LEN);
       i <= (ssize_t)(relativeTo.size() - MIN_MATCH_LEN);
       i++) {
    // Negative values truncate `trace`, positive values truncate `relativeTo`.
    kj::ArrayPtr<void* const> subtrace = trace.first(trace.size() - kj::max<ssize_t>(0, -i));
    kj::ArrayPtr<void* const> subrt = relativeTo
        .first(relativeTo.size() - kj::max<ssize_t>(0, i));

    uint matchLen = sharedSuffixLength(subtrace, subrt);
    if (matchLen > bestMatchLen) {
      bestMatchLen = matchLen;
      bestMatch = subtrace.first(subtrace.size() - matchLen + 1);
    }
  }

  return bestMatch;
}